

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

SourceRange __thiscall slang::syntax::DeferredSourceRange::get(DeferredSourceRange *this)

{
  bool bVar1;
  SyntaxNode *pSVar2;
  SourceRange *in_RDI;
  SourceRange SVar3;
  SyntaxNode *in_stack_00000010;
  SyntaxNode *ptr;
  SourceLocation local_38;
  SourceLocation local_30;
  
  bVar1 = PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool>::getInt
                    ((PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> *)(in_RDI + 1)
                    );
  if (!bVar1) {
    pSVar2 = PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool>::getPointer
                       ((PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> *)
                        (in_RDI + 1));
    if (pSVar2 != (SyntaxNode *)0x0) {
      SVar3 = SyntaxNode::sourceRange(in_stack_00000010);
      local_38 = SVar3.startLoc;
      in_RDI->startLoc = local_38;
      local_30 = SVar3.endLoc;
      in_RDI->endLoc = local_30;
    }
    PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool>::setInt
              ((PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> *)(in_RDI + 1),true)
    ;
  }
  return *in_RDI;
}

Assistant:

SourceRange get() const {
        if (!node.getInt()) {
            if (auto ptr = node.getPointer())
                range = ptr->sourceRange();
            node.setInt(true);
        }
        return range;
    }